

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void constant_time_conditional_memcpy(void *dst,void *src,size_t n,crypto_word_t mask)

{
  uint8_t uVar1;
  int iVar2;
  ulong local_40;
  size_t i;
  uint8_t *in;
  uint8_t *out;
  crypto_word_t mask_local;
  size_t n_local;
  void *src_local;
  void *dst_local;
  
  iVar2 = buffers_alias(dst,n,src,n);
  if (iVar2 != 0) {
    __assert_fail("!buffers_alias(dst, n, src, n)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/../internal.h"
                  ,0x19d,
                  "void constant_time_conditional_memcpy(void *, const void *, const size_t, const crypto_word_t)"
                 );
  }
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    uVar1 = constant_time_select_8
                      (mask,*(uint8_t *)((long)src + local_40),*(uint8_t *)((long)dst + local_40));
    *(uint8_t *)((long)dst + local_40) = uVar1;
  }
  return;
}

Assistant:

static inline void constant_time_conditional_memcpy(void *dst, const void *src,
                                                    const size_t n,
                                                    const crypto_word_t mask) {
  assert(!buffers_alias(dst, n, src, n));
  uint8_t *out = (uint8_t *)dst;
  const uint8_t *in = (const uint8_t *)src;
  for (size_t i = 0; i < n; i++) {
    out[i] = constant_time_select_8(mask, in[i], out[i]);
  }
}